

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_prot.c
# Opt level: O3

_Bool xdr_rpcb(XDR *xdrs,RPCB *objp)

{
  uint *puVar1;
  rpcvers_t *prVar2;
  xdr_op xVar3;
  uint uVar4;
  _Bool _Var5;
  bool_t bVar6;
  u_int in_EDX;
  u_int extraout_EDX;
  u_int extraout_EDX_00;
  u_int extraout_EDX_01;
  u_int extraout_EDX_02;
  u_int __maxsize;
  u_int __maxsize_00;
  
  xVar3 = xdrs->x_op;
  if (xVar3 == XDR_FREE) goto LAB_00117c01;
  if (xVar3 == XDR_DECODE) {
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar1) {
      _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,&objp->r_prog);
      in_EDX = extraout_EDX_00;
      goto LAB_00117b83;
    }
    uVar4 = *(uint *)xdrs->x_data;
    objp->r_prog = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    xdrs->x_data = (uint8_t *)puVar1;
  }
  else {
    if (xVar3 != XDR_ENCODE) {
      return false;
    }
    uVar4 = objp->r_prog;
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_wrap < puVar1) {
      _Var5 = (*xdrs->x_ops->x_putunit)(xdrs,uVar4);
      in_EDX = extraout_EDX;
LAB_00117b83:
      if (_Var5 == false) {
        return false;
      }
    }
    else {
      *(uint *)xdrs->x_data =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
    }
  }
  xVar3 = xdrs->x_op;
  if (xVar3 != XDR_FREE) {
    prVar2 = &objp->r_vers;
    if (xVar3 == XDR_DECODE) {
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if (puVar1 <= (xdrs->x_v).vio_tail) {
        uVar4 = *(uint *)xdrs->x_data;
        *prVar2 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
        goto LAB_00117c01;
      }
      _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,prVar2);
      in_EDX = extraout_EDX_02;
    }
    else {
      if (xVar3 != XDR_ENCODE) {
        return false;
      }
      uVar4 = *prVar2;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if (puVar1 <= (xdrs->x_v).vio_wrap) {
        *(uint *)xdrs->x_data =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
        goto LAB_00117c01;
      }
      _Var5 = (*xdrs->x_ops->x_putunit)(xdrs,uVar4);
      in_EDX = extraout_EDX_01;
    }
    if (_Var5 == false) {
      return false;
    }
  }
LAB_00117c01:
  bVar6 = xdr_string((XDR *)xdrs,&objp->r_netid,in_EDX);
  if (((char)bVar6 != '\0') &&
     (bVar6 = xdr_string((XDR *)xdrs,&objp->r_addr,__maxsize), (char)bVar6 != '\0')) {
    bVar6 = xdr_string((XDR *)xdrs,&objp->r_owner,__maxsize_00);
    return SUB41(bVar6,0);
  }
  return false;
}

Assistant:

bool
xdr_rpcb(XDR *xdrs, RPCB *objp)
{
	if (!xdr_u_int32_t(xdrs, &objp->r_prog))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->r_vers))
		return (false);
	if (!xdr_string(xdrs, &objp->r_netid, (u_int) ~ 0))
		return (false);
	if (!xdr_string(xdrs, &objp->r_addr, (u_int) ~ 0))
		return (false);
	if (!xdr_string(xdrs, &objp->r_owner, (u_int) ~ 0))
		return (false);
	return (true);
}